

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

int32_t ufmt_getArrayLength_63(UFormattable *fmt,UErrorCode *status)

{
  if (*(int *)(fmt + 5) == 4) {
    return *(int32_t *)(fmt + 2);
  }
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  *status = U_INVALID_FORMAT_ERROR;
  return 0;
}

Assistant:

const Formattable* 
Formattable::getArray(int32_t& count, UErrorCode& status) const 
{
    if (fType != kArray) {
        setError(status, U_INVALID_FORMAT_ERROR);
        count = 0;
        return NULL;
    }
    count = fValue.fArrayAndCount.fCount; 
    return fValue.fArrayAndCount.fArray;
}